

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xoshiro256plus.hpp
# Opt level: O3

basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *
trng::operator<<(basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *out,status_type *S)

{
  undefined4 uVar1;
  long lVar2;
  long lVar3;
  long *plVar4;
  undefined4 uVar5;
  undefined8 in_RAX;
  wostream *pwVar6;
  undefined8 uStack_28;
  
  lVar2 = *(long *)out;
  lVar3 = *(long *)(lVar2 + -0x18);
  uVar1 = *(undefined4 *)(out + lVar3 + 0x18);
  *(undefined4 *)(out + lVar3 + 0x18) = 0x26;
  plVar4 = *(long **)(out + *(long *)(lVar2 + -0x18) + 0xf0);
  uStack_28 = in_RAX;
  if (plVar4 != (long *)0x0) {
    uVar5 = (**(code **)(*plVar4 + 0x50))(plVar4,0x28);
    uStack_28 = CONCAT44(uVar5,(undefined4)uStack_28);
    pwVar6 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                       ((wostream *)out,(wchar_t *)((long)&uStack_28 + 4),1);
    pwVar6 = std::wostream::_M_insert<unsigned_long>((ulong)pwVar6);
    plVar4 = *(long **)(pwVar6 + *(long *)(*(long *)pwVar6 + -0x18) + 0xf0);
    if (plVar4 != (long *)0x0) {
      uVar5 = (**(code **)(*plVar4 + 0x50))(plVar4,0x20);
      uStack_28 = CONCAT44(uVar5,(undefined4)uStack_28);
      pwVar6 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                         (pwVar6,(wchar_t *)((long)&uStack_28 + 4),1);
      pwVar6 = std::wostream::_M_insert<unsigned_long>((ulong)pwVar6);
      plVar4 = *(long **)(pwVar6 + *(long *)(*(long *)pwVar6 + -0x18) + 0xf0);
      if (plVar4 != (long *)0x0) {
        uVar5 = (**(code **)(*plVar4 + 0x50))(plVar4,0x20);
        uStack_28 = CONCAT44(uVar5,(undefined4)uStack_28);
        pwVar6 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                           (pwVar6,(wchar_t *)((long)&uStack_28 + 4),1);
        pwVar6 = std::wostream::_M_insert<unsigned_long>((ulong)pwVar6);
        plVar4 = *(long **)(pwVar6 + *(long *)(*(long *)pwVar6 + -0x18) + 0xf0);
        if (plVar4 != (long *)0x0) {
          uVar5 = (**(code **)(*plVar4 + 0x50))(plVar4,0x20);
          uStack_28 = CONCAT44(uVar5,(undefined4)uStack_28);
          pwVar6 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                             (pwVar6,(wchar_t *)((long)&uStack_28 + 4),1);
          pwVar6 = std::wostream::_M_insert<unsigned_long>((ulong)pwVar6);
          plVar4 = *(long **)(pwVar6 + *(long *)(*(long *)pwVar6 + -0x18) + 0xf0);
          if (plVar4 != (long *)0x0) {
            uVar5 = (**(code **)(*plVar4 + 0x50))(plVar4,0x29);
            uStack_28 = CONCAT44(uVar5,(undefined4)uStack_28);
            std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                      (pwVar6,(wchar_t *)((long)&uStack_28 + 4),1);
            *(undefined4 *)(out + *(long *)(*(long *)out + -0x18) + 0x18) = uVar1;
            return out;
          }
        }
      }
    }
  }
  std::__throw_bad_cast();
}

Assistant:

std::basic_ostream<char_t, traits_t> &operator<<(
          std::basic_ostream<char_t, traits_t> &out, const status_type &S) {
        std::ios_base::fmtflags flags(out.flags());
        out.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
        out << '(' << S.r[0] << ' ' << S.r[1] << ' ' << S.r[2] << ' ' << S.r[3] << ')';
        out.flags(flags);
        return out;
      }